

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

ThreeAxisForceTorqueContactSensor * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::operator=
          (ThreeAxisForceTorqueContactSensor *this,ThreeAxisForceTorqueContactSensor *other)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar1;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar2;
  
  if (this != other) {
    pTVar1 = other->pimpl;
    pTVar2 = this->pimpl;
    std::__cxx11::string::_M_assign((string *)pTVar2);
    iDynTree::Transform::operator=(&pTVar2->link_H_sensor,&pTVar1->link_H_sensor);
    pTVar2->parent_link_index = pTVar1->parent_link_index;
    std::__cxx11::string::_M_assign((string *)&pTVar2->parent_link_name);
    std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::operator=
              (&pTVar2->m_loadCellLocations,&pTVar1->m_loadCellLocations);
  }
  return this;
}

Assistant:

ThreeAxisForceTorqueContactSensor& ThreeAxisForceTorqueContactSensor::operator=(const ThreeAxisForceTorqueContactSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}